

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

weak_ptr<libtorrent::aux::torrent> __thiscall
libtorrent::aux::session_impl::find_disconnect_candidate_torrent(session_impl *this)

{
  long *plVar1;
  torrent *ptVar2;
  long lVar3;
  _func_int **pp_Var4;
  bool bVar5;
  int iVar6;
  int iVar7;
  long *plVar8;
  bool bVar9;
  uint uVar10;
  __weak_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  long *plVar11;
  long *plVar12;
  weak_ptr<libtorrent::aux::torrent> wVar13;
  
  plVar8 = *(long **)(in_RSI + 0x1428);
  plVar1 = *(long **)(in_RSI + 0x1430);
  plVar11 = plVar8 + 2;
  plVar12 = plVar8;
  if (plVar11 != plVar1 && plVar8 != plVar1) {
    do {
      ptVar2 = (torrent *)*plVar11;
      iVar6 = (int)((ulong)((long)*(pointer *)
                                   ((long)&(ptVar2->super_torrent_hot_members).m_connections.
                                           super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                           .
                                           super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                           ._M_impl + 8) -
                           (long)(ptVar2->super_torrent_hot_members).m_connections.
                                 super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                 .
                                 super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
      iVar7 = (int)((ulong)((long)(ptVar2->m_peers_to_disconnect).
                                  super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(ptVar2->m_peers_to_disconnect).
                                 super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
      lVar3 = *plVar12;
      bVar9 = ((int)((ulong)(*(long *)(lVar3 + 0x40) - *(long *)(lVar3 + 0x38)) >> 3) !=
              (int)((ulong)(*(long *)(lVar3 + 0x500) - *(long *)(lVar3 + 0x4f8)) >> 4)) !=
              (iVar6 == iVar7);
      in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT71((int7)((ulong)lVar3 >> 8),bVar9);
      if (bVar9) {
        bVar9 = torrent::is_finished(ptVar2);
        bVar5 = torrent::is_finished((torrent *)*plVar12);
        ptVar2 = (torrent *)*plVar11;
        if (bVar9 == bVar5) {
          lVar3 = *plVar12;
          uVar10 = (int)((ulong)(*(long *)(lVar3 + 0x40) - *(long *)(lVar3 + 0x38)) >> 3) -
                   (int)((ulong)(*(long *)(lVar3 + 0x500) - *(long *)(lVar3 + 0x4f8)) >> 4);
          in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar10;
          bVar9 = (int)uVar10 <
                  (int)((ulong)((long)*(pointer *)
                                       ((long)&(ptVar2->super_torrent_hot_members).m_connections.
                                               super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                               .
                                               super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                               ._M_impl + 8) -
                               (long)(ptVar2->super_torrent_hot_members).m_connections.
                                     super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                     .
                                     super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) -
                  (int)((ulong)((long)(ptVar2->m_peers_to_disconnect).
                                      super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(ptVar2->m_peers_to_disconnect).
                                     super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
        }
        else {
          bVar9 = torrent::is_finished(ptVar2);
          in_RDX._M_pi = extraout_RDX;
        }
      }
      else {
        bVar9 = iVar6 != iVar7;
      }
      plVar8 = plVar11;
      if (bVar9 == false) {
        plVar8 = plVar12;
      }
      plVar11 = plVar11 + 2;
      plVar12 = plVar8;
    } while (plVar11 != plVar1);
  }
  if (plVar8 == *(long **)(in_RSI + 0x1430)) {
    (this->super_session_interface).super_session_logger._vptr_session_logger = (_func_int **)0x0;
    (this->super_dht_observer).super_dht_logger._vptr_dht_logger = (_func_int **)0x0;
  }
  else {
    (this->super_session_interface).super_session_logger._vptr_session_logger =
         (_func_int **)*plVar8;
    pp_Var4 = (_func_int **)plVar8[1];
    (this->super_dht_observer).super_dht_logger._vptr_dht_logger = pp_Var4;
    if (pp_Var4 != (_func_int **)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)((long)pp_Var4 + 0xc) = *(int *)((long)pp_Var4 + 0xc) + 1;
        UNLOCK();
      }
      else {
        *(int *)((long)pp_Var4 + 0xc) = *(int *)((long)pp_Var4 + 0xc) + 1;
      }
    }
  }
  wVar13.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  wVar13.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (weak_ptr<libtorrent::aux::torrent>)
         wVar13.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::weak_ptr<torrent> session_impl::find_disconnect_candidate_torrent() const
	{
		auto const i = std::min_element(m_torrents.begin(), m_torrents.end()
			, &compare_disconnect_torrent);

		TORRENT_ASSERT(i != m_torrents.end());
		if (i == m_torrents.end()) return std::shared_ptr<torrent>();

		return *i;
	}